

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_V5_MeshDoubleVertices::Transform(ON_V5_MeshDoubleVertices *this,ON_Xform *xform)

{
  bool bVar1;
  ON__UINT32 OVar2;
  ON__UINT32 OVar3;
  int iVar4;
  ON__UINT32 crc1;
  ON__UINT32 crc0;
  ON_Xform *xform_local;
  ON_V5_MeshDoubleVertices *this_local;
  
  bVar1 = ON_Xform::IsIdentity(xform,0.0);
  if (!bVar1) {
    OVar2 = DoubleCRC(this);
    ON_3dPointArray::Transform(&this->m_V5_dV,xform);
    OVar3 = DoubleCRC(this);
    if ((OVar2 == this->m_dCRC) &&
       (iVar4 = ON_SimpleArray<ON_3dPoint>::Count(&(this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>)
       , iVar4 == this->m_dcount)) {
      this->m_dCRC = OVar3;
    }
    else {
      this->m_dCRC = (uint)(OVar3 == 0);
    }
  }
  return true;
}

Assistant:

bool ON_V5_MeshDoubleVertices::Transform( const ON_Xform& xform )
{
  if ( !xform.IsIdentity() )
  {
    const ON__UINT32 crc0 = DoubleCRC();
    m_V5_dV.Transform(xform);
    const ON__UINT32 crc1 = DoubleCRC();
    if ( crc0 == m_dCRC && m_V5_dV.Count() == m_dcount )
      m_dCRC = crc1; // update m_dCRC so it stays valid
    else
      m_dCRC = (0==crc1)?1:0; // make sure m_dCRC is not valid
  }
  return true;
}